

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O3

void NOPN2_EnvelopeADSR(ym3438_t *chip)

{
  Bit8u BVar1;
  byte bVar2;
  Bit8u BVar3;
  ushort uVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ushort uVar9;
  uint uVar10;
  char cVar11;
  short sVar12;
  bool bVar13;
  
  uVar5 = chip->cycles + ((chip->cycles + 0x16) / 0x18) * -0x18 + 0x16;
  BVar1 = chip->eg_kon_latch[uVar5];
  bVar2 = chip->eg_state[uVar5];
  BVar3 = chip->eg_kon[uVar5];
  chip->eg_read[0] = (uint)chip->eg_read_inc;
  bVar8 = chip->eg_inc;
  chip->eg_read_inc = bVar8 != 0;
  if (BVar3 == '\0' && BVar1 != '\0') {
    chip->pg_reset[uVar5] = '\x01';
    bVar13 = false;
  }
  else {
    chip->pg_reset[uVar5] = chip->eg_ssg_pgrst_latch[uVar5] != '\0';
    if (BVar3 == '\0') {
      bVar13 = true;
    }
    else {
      bVar13 = chip->eg_ssg_repeat_latch[uVar5] == '\0';
    }
  }
  uVar9 = chip->eg_level[uVar5];
  uVar10 = 0x200 - uVar9 & 0x3ff;
  if (chip->eg_ssg_inv[uVar5] == '\0') {
    uVar10 = (uint)uVar9;
  }
  if (BVar3 == '\0') {
    uVar10 = (uint)uVar9;
  }
  if (BVar1 != '\0') {
    uVar10 = (uint)uVar9;
  }
  uVar9 = (ushort)uVar10;
  BVar3 = chip->eg_ssg_enable[uVar5];
  cVar11 = (~uVar10 & 0x3f0) == 0;
  if (BVar3 != '\0') {
    cVar11 = (char)(uVar10 >> 8) >> 1;
  }
  if (!bVar13) {
    if (chip->eg_ratemax == '\0') {
      bVar6 = 0;
      sVar12 = 0;
      if ((((bVar2 == 0) && (uVar9 != 0)) && (sVar12 = 0, BVar1 != '\0')) && (bVar8 != 0)) {
        sVar12 = (short)((uint)((int)(short)~uVar9 << (bVar8 & 0x1f)) >> 5);
        bVar6 = 0;
      }
    }
    else {
      uVar9 = 0;
      bVar6 = 0;
      sVar12 = 0;
    }
    goto LAB_0013d641;
  }
  bVar7 = bVar2;
  if (bVar2 - 2 < 2) {
    if (bVar8 == 0 || cVar11 != '\0') {
LAB_0013d587:
      sVar12 = 0;
    }
    else {
      sVar12 = (short)(1 << (bVar8 - 1 & 0x1f));
      if (BVar3 != '\0') {
        sVar12 = (short)(4 << (bVar8 - 1 & 0x1f));
      }
    }
  }
  else {
    if (bVar2 == 1) {
      if ((short)uVar9 >> 5 == (ushort)chip->eg_sl[1]) {
        bVar7 = 2;
      }
      else {
        bVar7 = 1;
        if (bVar8 != 0 && cVar11 == '\0') {
          sVar12 = (short)(1 << (bVar8 - 1 & 0x1f));
          bVar7 = 1;
          if (BVar3 != '\0') {
            sVar12 = (short)(4 << (bVar8 - 1 & 0x1f));
          }
          goto LAB_0013d634;
        }
      }
    }
    else {
      if (bVar2 != 0) goto LAB_0013d587;
      if (uVar9 == 0) {
        bVar7 = 1;
      }
      else {
        if (bVar8 != 0) {
          sVar12 = 0;
          bVar7 = 0;
          if ((BVar1 != '\0') && (sVar12 = 0, chip->eg_ratemax == '\0')) {
            sVar12 = (short)((uint)((int)(short)~uVar9 << (bVar8 & 0x1f)) >> 5);
            bVar7 = 0;
          }
          goto LAB_0013d634;
        }
        bVar7 = 0;
      }
    }
    sVar12 = 0;
  }
LAB_0013d634:
  bVar6 = 3;
  if (BVar1 != '\0') {
    bVar6 = bVar7;
  }
LAB_0013d641:
  if (chip->eg_kon_csm[uVar5] != '\0') {
    uVar9 = uVar9 | (ushort)chip->eg_tl[1] << 3;
  }
  bVar8 = bVar6;
  if ((bVar13) && (chip->eg_ssg_hold_up_latch[uVar5] == '\0')) {
    uVar4 = 0x3ff;
    if (bVar2 == 0 || cVar11 == '\0') {
      uVar4 = uVar9;
    }
    uVar9 = uVar4;
    bVar8 = 3;
    if (bVar2 == 0 || cVar11 == '\0') {
      bVar8 = bVar6;
    }
  }
  chip->eg_kon[uVar5] = BVar1;
  chip->eg_level[uVar5] = uVar9 + sVar12 & 0x3ff;
  chip->eg_state[uVar5] = bVar8;
  return;
}

Assistant:

void NOPN2_EnvelopeADSR(ym3438_t *chip)
{
    Bit32u slot = (chip->cycles + 22) % 24;

    Bit8u nkon = chip->eg_kon_latch[slot];
    Bit8u okon = chip->eg_kon[slot];
    Bit8u kon_event;
    Bit8u koff_event;
    Bit8u eg_off;
    Bit16s level;
    Bit16s nextlevel = 0;
    Bit16s ssg_level;
    Bit8u nextstate = chip->eg_state[slot];
    Bit16s inc = 0;
    chip->eg_read[0] = chip->eg_read_inc;
    chip->eg_read_inc = chip->eg_inc > 0;

    /* Reset phase generator */
    chip->pg_reset[slot] = (nkon && !okon) || chip->eg_ssg_pgrst_latch[slot];

    /* KeyOn/Off */
    kon_event = (nkon && !okon) || (okon && chip->eg_ssg_repeat_latch[slot]);
    koff_event = okon && !nkon;

    ssg_level = level = (Bit16s)chip->eg_level[slot];

    if (chip->eg_ssg_inv[slot])
    {
        /* Inverse */
        ssg_level = 512 - level;
        ssg_level &= 0x3ff;
    }
    if (koff_event)
    {
        level = ssg_level;
    }
    if (chip->eg_ssg_enable[slot])
    {
        eg_off = level >> 9;
    }
    else
    {
        eg_off = (level & 0x3f0) == 0x3f0;
    }
    nextlevel = level;
    if (kon_event)
    {
        nextstate = eg_num_attack;
        /* Instant attack */
        if (chip->eg_ratemax)
        {
            nextlevel = 0;
        }
        else if (chip->eg_state[slot] == eg_num_attack && level != 0 && chip->eg_inc && nkon)
        {
            inc = (~level << chip->eg_inc) >> 5;
        }
    }
    else
    {
        switch (chip->eg_state[slot])
        {
        case eg_num_attack:
            if (level == 0)
            {
                nextstate = eg_num_decay;
            }
            else if(chip->eg_inc && !chip->eg_ratemax && nkon)
            {
                inc = (~level << chip->eg_inc) >> 5;
            }
            break;
        case eg_num_decay:
            if ((level >> 5) == chip->eg_sl[1])
            {
                nextstate = eg_num_sustain;
            }
            else if (!eg_off && chip->eg_inc)
            {
                inc = 1 << (chip->eg_inc - 1);
                if (chip->eg_ssg_enable[slot])
                {
                    inc <<= 2;
                }
            }
            break;
        case eg_num_sustain:
        case eg_num_release:
            if (!eg_off && chip->eg_inc)
            {
                inc = 1 << (chip->eg_inc - 1);
                if (chip->eg_ssg_enable[slot])
                {
                    inc <<= 2;
                }
            }
            break;
        default:
            break;
        }
        if (!nkon)
        {
            nextstate = eg_num_release;
        }
    }
    if (chip->eg_kon_csm[slot])
    {
        nextlevel |= chip->eg_tl[1] << 3;
    }

    /* Envelope off */
    if (!kon_event && !chip->eg_ssg_hold_up_latch[slot] && chip->eg_state[slot] != eg_num_attack && eg_off)
    {
        nextstate = eg_num_release;
        nextlevel = 0x3ff;
    }

    nextlevel += inc;

    chip->eg_kon[slot] = chip->eg_kon_latch[slot];
    chip->eg_level[slot] = (Bit16u)nextlevel & 0x3ff;
    chip->eg_state[slot] = nextstate;
}